

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteRedundantCasts.cpp
# Opt level: O0

Expr * __thiscall RedundantCastsVisitor::simplify(RedundantCastsVisitor *this,Expr *expr)

{
  ret_type pCVar1;
  ret_type pCVar2;
  Expr *in_RSI;
  CastExpr *inner;
  Expr *innermost;
  CastExpr *cast;
  Expr *in_stack_ffffffffffffffe0;
  Expr *Val;
  
  pCVar1 = llvm::dyn_cast_or_null<CastExpr,Expr>(in_stack_ffffffffffffffe0);
  if (pCVar1 != (ret_type)0x0) {
    Val = (pCVar1->super_UnaryExpr).expr;
    while( true ) {
      pCVar2 = llvm::dyn_cast_or_null<CastExpr,Expr>(Val);
      if (pCVar2 == (ret_type)0x0) break;
      Val = (pCVar2->super_UnaryExpr).expr;
    }
    (pCVar1->super_UnaryExpr).expr = Val;
  }
  return in_RSI;
}

Assistant:

Expr* RedundantCastsVisitor::simplify(Expr* expr) {
    if (auto* cast = llvm::dyn_cast_or_null<CastExpr>(expr)) {
        Expr* innermost = cast->expr;

        while (auto* inner = llvm::dyn_cast_or_null<CastExpr>(innermost)) {
            innermost = inner->expr;
        }

        cast->expr = innermost;
    }

    return expr;
}